

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O0

void references::scheme::add_globals(environment *env)

{
  environment *peVar1;
  cell *pcVar2;
  allocator local_721;
  string local_720;
  cell local_700;
  allocator local_6a9;
  string local_6a8;
  cell local_688;
  allocator local_631;
  string local_630;
  cell local_610;
  allocator local_5b9;
  string local_5b8;
  cell local_598;
  allocator local_541;
  string local_540;
  cell local_520;
  allocator local_4c9;
  string local_4c8;
  cell local_4a8;
  allocator local_451;
  string local_450;
  cell local_430;
  allocator local_3d9;
  string local_3d8;
  cell local_3b8;
  allocator local_361;
  string local_360;
  cell local_340;
  allocator local_2e9;
  string local_2e8;
  cell local_2c8;
  allocator local_271;
  string local_270;
  cell local_250;
  allocator local_1f9;
  string local_1f8;
  cell local_1d8;
  allocator local_181;
  string local_180;
  cell local_160;
  allocator local_109;
  string local_108;
  cell local_e8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  environment *local_10;
  environment *env_local;
  
  local_10 = env;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"nil",&local_31);
  pcVar2 = environment::operator[](env,&local_30);
  cell::operator=(pcVar2,(cell *)nil);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"#f",&local_69);
  pcVar2 = environment::operator[](peVar1,&local_68);
  cell::operator=(pcVar2,(cell *)false_sym);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"#t",&local_91);
  pcVar2 = environment::operator[](peVar1,&local_90);
  cell::operator=(pcVar2,(cell *)true_sym);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  cell::cell(&local_e8,proc_append);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"append",&local_109);
  pcVar2 = environment::operator[](peVar1,&local_108);
  cell::operator=(pcVar2,&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  cell::~cell(&local_e8);
  cell::cell(&local_160,proc_head);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"head",&local_181);
  pcVar2 = environment::operator[](peVar1,&local_180);
  cell::operator=(pcVar2,&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  cell::~cell(&local_160);
  cell::cell(&local_1d8,proc_tail);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"tail",&local_1f9);
  pcVar2 = environment::operator[](peVar1,&local_1f8);
  cell::operator=(pcVar2,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  cell::~cell(&local_1d8);
  cell::cell(&local_250,proc_cons);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"cons",&local_271);
  pcVar2 = environment::operator[](peVar1,&local_270);
  cell::operator=(pcVar2,&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  cell::~cell(&local_250);
  cell::cell(&local_2c8,proc_length);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"length",&local_2e9);
  pcVar2 = environment::operator[](peVar1,&local_2e8);
  cell::operator=(pcVar2,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  cell::~cell(&local_2c8);
  cell::cell(&local_340,proc_list);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_360,"list",&local_361);
  pcVar2 = environment::operator[](peVar1,&local_360);
  cell::operator=(pcVar2,&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  cell::~cell(&local_340);
  cell::cell(&local_3b8,proc_nullp);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d8,"null?",&local_3d9);
  pcVar2 = environment::operator[](peVar1,&local_3d8);
  cell::operator=(pcVar2,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  cell::~cell(&local_3b8);
  cell::cell(&local_430,proc_add);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,"+",&local_451);
  pcVar2 = environment::operator[](peVar1,&local_450);
  cell::operator=(pcVar2,&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  cell::~cell(&local_430);
  cell::cell(&local_4a8,proc_sub);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c8,"-",&local_4c9);
  pcVar2 = environment::operator[](peVar1,&local_4c8);
  cell::operator=(pcVar2,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  cell::~cell(&local_4a8);
  cell::cell(&local_520,proc_mul);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"*",&local_541);
  pcVar2 = environment::operator[](peVar1,&local_540);
  cell::operator=(pcVar2,&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  cell::~cell(&local_520);
  cell::cell(&local_598,proc_div);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b8,"/",&local_5b9);
  pcVar2 = environment::operator[](peVar1,&local_5b8);
  cell::operator=(pcVar2,&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  cell::~cell(&local_598);
  cell::cell(&local_610,proc_greater);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_630,">",&local_631);
  pcVar2 = environment::operator[](peVar1,&local_630);
  cell::operator=(pcVar2,&local_610);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  cell::~cell(&local_610);
  cell::cell(&local_688,proc_less);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a8,"<",&local_6a9);
  pcVar2 = environment::operator[](peVar1,&local_6a8);
  cell::operator=(pcVar2,&local_688);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  cell::~cell(&local_688);
  cell::cell(&local_700,proc_less_equal);
  peVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_720,"<=",&local_721);
  pcVar2 = environment::operator[](peVar1,&local_720);
  cell::operator=(pcVar2,&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  cell::~cell(&local_700);
  return;
}

Assistant:

void add_globals(environment & env)
{
	env["nil"] = nil;   env["#f"] = false_sym;  env["#t"] = true_sym;
	env["append"] = cell(&proc_append);   env["head"] = cell(&proc_head);
	env["tail"] = cell(&proc_tail);      env["cons"] = cell(&proc_cons);
	env["length"] = cell(&proc_length);   env["list"] = cell(&proc_list);
	env["null?"] = cell(&proc_nullp);    env["+"] = cell(&proc_add);
	env["-"] = cell(&proc_sub);      env["*"] = cell(&proc_mul);
	env["/"] = cell(&proc_div);      env[">"] = cell(&proc_greater);
	env["<"] = cell(&proc_less);     env["<="] = cell(&proc_less_equal);
}